

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::StartTracingResponse::ParseFromArray
          (StartTracingResponse *this,void *raw,size_t size)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t *end;
  uint uVar8;
  ulong uVar9;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_50;
  uint16_t local_4c;
  uint8_t local_4a;
  StartTracingResponse *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  uint64_t payload_length_1;
  
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar7 = 0;
  local_48 = this;
  do {
    if (end <= raw) goto switchD_0030a886_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar4 != (uint64_t *)raw) goto LAB_0030a850;
LAB_0030ab58:
      uVar7 = 0;
      uVar5 = 0;
      goto LAB_0030a97f;
    }
    puVar4 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_0030a850:
    uVar1 = preamble;
    uVar9 = preamble >> 3;
    uVar8 = (uint)uVar9;
    if ((uVar8 == 0) || (end <= puVar4)) goto LAB_0030ab58;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar4,(uint8_t *)end,&int_value);
      uVar6 = 0;
      uVar5 = 0;
      if (puVar3 == puVar4) goto LAB_0030a97f;
      break;
    case 1:
      puVar3 = puVar4 + 1;
      if (end < puVar3) goto switchD_0030a886_caseD_3;
      int_value = *puVar4;
LAB_0030a8d2:
      uVar6 = 0;
      break;
    case 2:
      puVar2 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar4,(uint8_t *)end,&payload_length)
      ;
      if ((puVar2 == puVar4) || ((ulong)((long)end - (long)puVar2) < payload_length))
      goto switchD_0030a886_caseD_3;
      puVar3 = (uint64_t *)((long)puVar2 + payload_length);
      uVar6 = payload_length;
      int_value = (uint64_t)puVar2;
      break;
    default:
      goto switchD_0030a886_caseD_3;
    case 5:
      puVar3 = (uint64_t *)((long)puVar4 + 4);
      if (puVar3 <= end) {
        int_value = (uint64_t)(uint)*puVar4;
        goto LAB_0030a8d2;
      }
      goto switchD_0030a886_caseD_3;
    }
    raw = puVar3;
  } while ((0xffff < uVar8) || (0xfffffff < uVar6));
  uVar7 = uVar6 | (uVar1 & 7) << 0x30 | uVar9 << 0x20;
  uVar5 = int_value;
LAB_0030a97f:
  local_48 = (StartTracingResponse *)&local_48->_has_field_;
LAB_0030a98d:
  do {
    preamble = uVar5;
    local_50 = (uint32_t)uVar7;
    local_4a = (uint8_t)(uVar7 >> 0x30);
    local_4c = (uint16_t)(uVar7 >> 0x20);
    if (local_4c == 1) {
      std::bitset<2UL>::set((bitset<2UL> *)local_48,1,true);
    }
    else if ((uVar7 & 0xffff00000000) == 0) {
      return end == (uint64_t *)raw;
    }
    protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
              ((Field *)&preamble,local_40);
    do {
      if (end <= raw) {
LAB_0030ab35:
        uVar7 = 0;
        uVar5 = 0;
        goto LAB_0030a98d;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar4 == (uint64_t *)raw) goto LAB_0030ab35;
      }
      else {
        puVar4 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar1 = int_value;
      uVar9 = int_value >> 3;
      uVar8 = (uint)uVar9;
      if ((uVar8 == 0) || (end <= puVar4)) goto LAB_0030ab35;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar4,(uint8_t *)end,&payload_length);
        uVar6 = 0;
        uVar7 = 0;
        uVar5 = 0;
        if (puVar3 == puVar4) goto LAB_0030a98d;
        break;
      case 1:
        puVar3 = puVar4 + 1;
        if (end < puVar3) goto switchD_0030aa3f_caseD_3;
        payload_length = *puVar4;
LAB_0030aa97:
        uVar6 = 0;
        break;
      case 2:
        puVar2 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar4,(uint8_t *)end,&payload_length_1);
        if ((puVar2 == puVar4) || ((ulong)((long)end - (long)puVar2) < payload_length_1))
        goto switchD_0030aa3f_caseD_3;
        puVar3 = (uint64_t *)((long)puVar2 + payload_length_1);
        uVar6 = payload_length_1;
        payload_length = (uint64_t)puVar2;
        break;
      default:
        goto switchD_0030aa3f_caseD_3;
      case 5:
        puVar3 = (uint64_t *)((long)puVar4 + 4);
        if (puVar3 <= end) {
          payload_length = (uint64_t)(uint)*puVar4;
          goto LAB_0030aa97;
        }
        goto switchD_0030aa3f_caseD_3;
      }
      raw = puVar3;
    } while ((0xffff < uVar8) || (0xfffffff < uVar6));
    uVar7 = uVar6 | (uVar1 & 7) << 0x30 | uVar9 << 0x20;
    uVar5 = payload_length;
  } while( true );
switchD_0030a886_caseD_3:
  uVar7 = 0;
  uVar5 = 0;
  goto LAB_0030a97f;
switchD_0030aa3f_caseD_3:
  uVar7 = 0;
  uVar5 = 0;
  goto LAB_0030a98d;
}

Assistant:

bool StartTracingResponse::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}